

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

void mp_cond_negate(mp_int *r,mp_int *x,uint yes)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  BignumInt BVar5;
  BignumInt BVar6;
  
  uVar4 = (ulong)yes;
  uVar2 = -uVar4;
  uVar1 = r->nw;
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    if (uVar3 < x->nw) {
      BVar5 = x->w[uVar3];
    }
    else {
      BVar5 = 0;
    }
    BVar6 = (BVar5 ^ uVar2) + uVar4;
    uVar4 = (ulong)CARRY8(BVar5 ^ uVar2,uVar4);
    r->w[uVar3] = BVar6;
  }
  return;
}

Assistant:

static void mp_cond_negate(mp_int *r, mp_int *x, unsigned yes)
{
    BignumCarry carry = yes;
    BignumInt flip = -(BignumInt)yes;
    for (size_t i = 0; i < r->nw; i++) {
        BignumInt xword = mp_word(x, i);
        xword ^= flip;
        BignumADC(r->w[i], carry, 0, xword, carry);
    }
}